

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O2

void c140_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  __s = *outputs;
  __s_00 = outputs[1];
  uVar15 = (ulong)samples;
  memset(__s,0,uVar15 * 4);
  memset(__s_00,0,uVar15 * 4);
  lVar2 = *(long *)((long)param + 0x20);
  if (lVar2 == 0) {
    return;
  }
  lVar5 = 0;
LAB_0015b600:
  if (lVar5 == 0x18) {
    return;
  }
  if ((*(char *)((long)param + lVar5 * 0x24 + 0x448) != '\0') &&
     (puVar6 = (uint *)((long)param + lVar5 * 0x24 + 0x428), *(char *)((long)puVar6 + 0x21) == '\0')
     ) {
    lVar7 = lVar5 * 0x10;
    uVar8 = *(ushort *)((long)param + lVar7 + 0x2a);
    uVar8 = uVar8 << 8 | uVar8 >> 8;
    if (uVar8 != 0) {
      uVar10 = (uint)*(byte *)((long)param + lVar7 + 0x2c) * 0x10000 + puVar6[5];
      if (*(char *)((long)param + 0x14) == '\x01') {
        uVar3 = uVar10 >> 1 & 0x180000;
LAB_0015b679:
        uVar3 = uVar10 & 0x7ffff | uVar3;
      }
      else {
        uVar3 = 0;
        if (*(char *)((long)param + 0x14) == '\0') {
          uVar3 = uVar10 >> 2 & 0x80000;
          goto LAB_0015b679;
        }
      }
      iVar9 = (int)((float)uVar8 * *(float *)((long)param + 0x10));
      iVar11 = puVar6[6] - puVar6[5];
      lVar12 = (ulong)uVar3 + lVar2;
      bVar1 = *(byte *)((long)param + lVar7 + 0x2d);
      uVar14 = 0;
      if ((bVar1 & 8) == 0) {
        for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          uVar10 = *puVar6 + iVar9;
          uVar3 = uVar10 & 0xffff;
          uVar10 = uVar10 >> 0x10 & 0x7fff;
          *puVar6 = uVar3;
          uVar13 = puVar6[1] + uVar10;
          puVar6[1] = uVar13;
          if (iVar11 <= (int)uVar13) {
            if ((bVar1 & 0x10) == 0) goto LAB_0015b7cd;
            uVar13 = puVar6[7] - puVar6[5];
            puVar6[1] = uVar13;
          }
          if (uVar10 == 0) {
            uVar10 = puVar6[3];
            uVar13 = puVar6[4];
          }
          else {
            uVar10 = puVar6[2];
            puVar6[3] = uVar10;
            uVar13 = *(char *)(lVar12 + (int)uVar13) * 0x100;
            puVar6[2] = uVar13;
            uVar13 = uVar13 - uVar10;
            puVar6[4] = uVar13;
          }
          iVar4 = ((int)(uVar13 * uVar3) >> 0x10) + uVar10;
          __s[uVar14] = __s[uVar14] +
                        ((int)((uint)*(byte *)((long)param + lVar7 + 0x29) * iVar4) >> 8);
          __s_00[uVar14] =
               __s_00[uVar14] + ((int)((uint)*(byte *)((long)param + lVar7 + 0x28) * iVar4) >> 8);
        }
      }
      else {
        for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          uVar10 = *puVar6 + iVar9;
          uVar3 = uVar10 & 0xffff;
          *puVar6 = uVar3;
          uVar10 = (uVar10 >> 0x10 & 0x7fff) + puVar6[1];
          puVar6[1] = uVar10;
          if (iVar11 <= (int)uVar10) {
            if ((bVar1 & 0x10) == 0) goto LAB_0015b7cd;
            uVar10 = puVar6[7] - puVar6[5];
            puVar6[1] = uVar10;
          }
          uVar13 = puVar6[2];
          puVar6[3] = uVar13;
          uVar10 = (uint)*(short *)((long)param + (ulong)*(byte *)(lVar12 + (int)uVar10) * 2 + 0x228
                                   );
          puVar6[2] = uVar10;
          uVar10 = uVar10 - uVar13;
          puVar6[4] = uVar10;
          iVar4 = ((int)(uVar10 * uVar3) >> 0x10) + uVar13;
          __s[uVar14] = __s[uVar14] +
                        ((int)((uint)*(byte *)((long)param + lVar7 + 0x29) * iVar4) >> 8);
          __s_00[uVar14] =
               __s_00[uVar14] + ((int)((uint)*(byte *)((long)param + lVar7 + 0x28) * iVar4) >> 8);
        }
      }
    }
  }
  goto LAB_0015b625;
LAB_0015b7cd:
  *(undefined1 *)(puVar6 + 8) = 0;
LAB_0015b625:
  lVar5 = lVar5 + 1;
  goto LAB_0015b600;
}

Assistant:

static void c140_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c140_state *info = (c140_state *)param;
	UINT32  i,j;

	INT32   dt;
	INT32   sz;

	UINT8   *pSampleData;
	INT32   frequency,delta;
	UINT32  cnt;

	DEV_SMPL *lmix, *rmix;

	/* Set mixer outputs base pointers */
	lmix = outputs[0];
	rmix = outputs[1];

	/* zap the contents of the mixer buffer */
	memset(lmix, 0, samples * sizeof(DEV_SMPL));
	memset(rmix, 0, samples * sizeof(DEV_SMPL));
	if (info->pRom == NULL)
		return;

	//--- audio update
	for( i=0;i<MAX_VOICE;i++ )
	{
		C140_VOICE *v = &info->voi[i];
		const struct voice_registers *vreg = (struct voice_registers *)&info->REG[i*16];

		if( v->key && ! v->Muted)
		{
			frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;

			/* Abort voice if no frequency value set */
			if(frequency==0) continue;

			/* Delta =  frequency * ((8MHz/374)*2 / sample rate) */
			delta=(INT32)((float)frequency * info->pbase);

			/* calculate sample size */
			sz=v->sample_end-v->sample_start;

			/* Retrieve base pointer to the sample data */
			pSampleData = info->pRom + find_sample(info, v->sample_start, vreg->bank, i);

			/* Switch on data type - compressed PCM is only for C140 */
			if (vreg->mode&C140_MODE_MULAW)
			{
				//compressed PCM (maybe correct...)
				/* Loop for enough to fill sample buffer as requested */
				for(j=0;j<samples;j++)
				{
					v->ptoffset += delta;
					cnt = (v->ptoffset>>16)&0x7fff;
					v->ptoffset &= 0xffff;
					v->pos+=cnt;
					//for(;cnt>0;cnt--)
					{
						/* Check for the end of the sample */
						if(v->pos >= sz)
						{
							/* Check if its a looping sample, either stop or loop */
							if(vreg->mode&C140_MODE_LOOP)
							{
								v->pos = v->sample_loop - v->sample_start;
							}
							else
							{
								v->key=0;
								break;
							}
						}

						v->prevdt=v->lastdt;
						v->lastdt=info->mulaw_table[pSampleData[v->pos]];
						v->dltdt=(v->lastdt - v->prevdt);
					}

					/* Caclulate the sample value */
					dt=((v->dltdt*v->ptoffset)>>16)+v->prevdt;

					/* Write the data to the sample buffers */
					lmix[j]+=(dt*vreg->volume_left)>>8;
					rmix[j]+=(dt*vreg->volume_right)>>8;
				}
			}
			else
			{
				/* linear 8bit signed PCM */
				for(j=0;j<samples;j++)
				{
					v->ptoffset += delta;
					cnt = (v->ptoffset>>16)&0x7fff;
					v->ptoffset &= 0xffff;
					v->pos += cnt;
					/* Check for the end of the sample */
					if(v->pos >= sz)
					{
						/* Check if its a looping sample, either stop or loop */
						if( vreg->mode&C140_MODE_LOOP )
						{
							v->pos = v->sample_loop - v->sample_start;
						}
						else
						{
							v->key=0;
							break;
						}
					}

					if( cnt )
					{
						v->prevdt=v->lastdt;
						v->lastdt=(INT8)pSampleData[v->pos]<<8;
						v->dltdt = (v->lastdt - v->prevdt);
					}

					/* Caclulate the sample value */
					dt=((v->dltdt*v->ptoffset)>>16)+v->prevdt;

					/* Write the data to the sample buffers */
					lmix[j]+=(dt*vreg->volume_left)>>8;
					rmix[j]+=(dt*vreg->volume_right)>>8;
				}
			}
		}
	}
}